

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ParamListStandard::forceInactiveChain
          (ParamListStandard *this,ParamActive *active,int4 maxchain,int4 start,int4 stop)

{
  int iVar1;
  uint uVar2;
  ParamEntry *this_00;
  bool bVar3;
  bool bVar4;
  int4 iVar5;
  int4 iVar6;
  ParamTrial *trial;
  long lVar7;
  pointer pPVar8;
  int iVar9;
  long lVar10;
  Address *addr;
  int iVar11;
  int iVar12;
  
  iVar12 = -1;
  lVar7 = (long)start;
  if (start < stop) {
    pPVar8 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = this->nonfloatgroup;
    addr = &pPVar8[lVar7 + -1].addr;
    lVar10 = 0;
    bVar4 = false;
    bVar3 = false;
    iVar9 = 0;
    do {
      this_00 = (ParamEntry *)addr[4].offset;
      if (this_00 != (ParamEntry *)0x0) {
        uVar2 = (uint)addr[2].offset;
        if ((uVar2 & 8) == 0) {
          if ((((uVar2 & 0x10) != 0) && (active->recoversubcall == true)) &&
             (bVar3 = bVar4, (addr[3].base)->type == IPTR_SPACEBASE)) {
            bVar3 = true;
          }
          if (lVar10 == 0) {
            if (this_00->type == TYPE_FLOAT) {
              iVar5 = ParamEntry::getSlot(pPVar8->entry,&pPVar8->addr,pPVar8->size + -1);
            }
            else {
              iVar5 = ParamEntry::getSlot(this_00,addr + 3,*(int *)&addr[4].base + -1);
              iVar5 = iVar5 - iVar1;
            }
            iVar11 = iVar5 + 1;
          }
          else {
            iVar5 = ParamEntry::getSlot(this_00,addr + 3,*(int *)&addr[4].base + -1);
            iVar6 = ParamEntry::getSlot((ParamEntry *)addr[1].offset,addr,*(int *)&addr[1].base + -1
                                       );
            iVar11 = iVar5 - iVar6;
          }
          iVar9 = iVar9 + iVar11;
          bVar4 = bVar3;
          if (maxchain < iVar9) {
            bVar3 = true;
            bVar4 = bVar3;
          }
        }
        else {
          if (!bVar3) {
            iVar12 = start + (int)lVar10;
          }
          iVar9 = 0;
        }
        if (bVar3) {
          *(uint *)&addr[2].offset = (uVar2 & 0xfffffff6) + 1;
        }
      }
      lVar10 = lVar10 + 1;
      addr = addr + 3;
    } while (stop - lVar7 != lVar10);
  }
  if (start <= iVar12) {
    pPVar8 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start + lVar7;
    iVar12 = (iVar12 - start) + 1;
    do {
      if ((pPVar8->flags & 0xc) == 0) {
        pPVar8->flags = pPVar8->flags | 9;
      }
      pPVar8 = pPVar8 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  return;
}

Assistant:

void ParamListStandard::forceInactiveChain(ParamActive *active,int4 maxchain,int4 start,int4 stop) const

{
  bool seenchain = false;
  int4 chainlength = 0;
  int4 max = -1;
  for(int4 i=start;i<stop;++i) {
    ParamTrial &trial(active->getTrial(i));
    if (trial.getEntry() == (const ParamEntry *)0) continue; // Already know not used
    if (!trial.isActive()) {
      if (trial.isUnref()&&active->isRecoverSubcall()) {
	// If there is no reference to the trial within the function, the only real possibility
	// is that a register is an input to the calling function and it is being reused (immediately)
	// to pass the input into the called function.  This really can't happen on the stack because
	// the stack relative caller offset and callee offset are different
	if (trial.getAddress().getSpace()->getType() == IPTR_SPACEBASE) // So if the parameter is on the stack
	  seenchain = true;	// Mark that we have already seen an inactive chain
      }
      if (i==start) {
	if (trial.getEntry()->getType() == TYPE_FLOAT)
	  chainlength += (active->getTrial(0).slotGroup()+1);
	else
	  chainlength += (trial.slotGroup() - nonfloatgroup + 1);
      }
      else
	chainlength += trial.slotGroup() - active->getTrial(i-1).slotGroup();
      if (chainlength > maxchain)
	seenchain = true;
    }
    else {
      chainlength = 0;
      if (!seenchain)
	max = i;
    }
    if (seenchain)
      trial.markInactive();
  }
  for(int4 i=start;i<=max;++i) { // Across the range of active trials, fill in "holes" of inactive trials
    ParamTrial &trial(active->getTrial(i));
    if (trial.isDefinitelyNotUsed()) continue;
    if (!trial.isActive())
      trial.markActive();
  }
}